

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3OptionalTest_TextFormatRoundTripZeros_Test::
Proto3OptionalTest_TextFormatRoundTripZeros_Test
          (Proto3OptionalTest_TextFormatRoundTripZeros_Test *this)

{
  Proto3OptionalTest_TextFormatRoundTripZeros_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__Proto3OptionalTest_TextFormatRoundTripZeros_Test_029e3bd8;
  return;
}

Assistant:

TEST(Proto3OptionalTest, TextFormatRoundTripZeros) {
  proto2_unittest::TestProto3Optional msg;
  SetAllFieldsZero(&msg);

  proto2_unittest::TestProto3Optional msg2;
  std::string text;
  EXPECT_TRUE(TextFormat::PrintToString(msg, &text));
  EXPECT_TRUE(TextFormat::ParseFromString(text, &msg2));
  TestAllFieldsSet(msg2, true);
  TestAllFieldsZero(msg2);
}